

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_tile_data(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  long *local_50;
  AV1Decoder *pbi;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  aom_tile_data *tile_data;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t *ctx_local;
  aom_codec_err_t local_4;
  
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_50 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_50 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = local_50 + 1;
  }
  puVar2 = (undefined8 *)*local_50;
  if (puVar2 == (undefined8 *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (ctx->frame_worker == (AVxWorker *)0x0) {
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    lVar3 = *ctx->frame_worker->data1;
    *puVar2 = *(undefined8 *)
               (lVar3 + (long)*(int *)(lVar3 + 0x58da0) * 0x400 +
                (long)*(int *)(lVar3 + 0x58da4) * 0x10 + 0x48d38);
    puVar2[1] = *(undefined8 *)
                 (lVar3 + 0x48d30 + (long)*(int *)(lVar3 + 0x58da0) * 0x400 +
                 (long)*(int *)(lVar3 + 0x58da4) * 0x10);
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_tile_data(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  aom_tile_data *const tile_data = va_arg(args, aom_tile_data *);

  if (tile_data) {
    if (ctx->frame_worker) {
      AVxWorker *const worker = ctx->frame_worker;
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1Decoder *pbi = frame_worker_data->pbi;
      tile_data->coded_tile_data_size =
          pbi->tile_buffers[pbi->dec_tile_row][pbi->dec_tile_col].size;
      tile_data->coded_tile_data =
          pbi->tile_buffers[pbi->dec_tile_row][pbi->dec_tile_col].data;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}